

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O0

void init_calendar_record(calendar_record_t *record)

{
  calendar_record_t *record_local;
  
  strcpy(record->service_id,"");
  strcpy(record->start_date,"");
  strcpy(record->end_date,"");
  record->monday = SA_NOT_SET;
  record->tuesday = SA_NOT_SET;
  record->wednesday = SA_NOT_SET;
  record->thursday = SA_NOT_SET;
  record->friday = SA_NOT_SET;
  record->saturday = SA_NOT_SET;
  record->sunday = SA_NOT_SET;
  return;
}

Assistant:

void init_calendar_record(calendar_record_t *record) {
    strcpy(record->service_id, "");
    strcpy(record->start_date, "");
    strcpy(record->end_date, "");
    record->monday = SA_NOT_SET;
    record->tuesday = SA_NOT_SET;
    record->wednesday = SA_NOT_SET;
    record->thursday = SA_NOT_SET;
    record->friday = SA_NOT_SET;
    record->saturday = SA_NOT_SET;
    record->sunday = SA_NOT_SET;
}